

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int safe_var_substitution_p(gen_ctx_t gen_ctx,MIR_reg_t var,bb_insn_t_conflict bb_insn)

{
  size_t sVar1;
  dead_var_t_conflict pdVar2;
  bool local_21;
  bb_insn_t_conflict bb_insn_local;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  local_21 = false;
  if (var != 0xffffffff) {
    sVar1 = VARR_size_tlength(gen_ctx->combine_ctx->var_ref_ages);
    local_21 = false;
    if (((var < sVar1) &&
        (local_21 = false,
        gen_ctx->combine_ctx->var_ref_ages_addr[var] == gen_ctx->combine_ctx->curr_bb_var_ref_age))
       && (local_21 = false, gen_ctx->combine_ctx->var_refs_addr[var].def_p != '\0')) {
      pdVar2 = find_bb_insn_dead_var(bb_insn,var);
      local_21 = pdVar2 != (dead_var_t_conflict)0x0;
    }
  }
  return (int)local_21;
}

Assistant:

static int safe_var_substitution_p (gen_ctx_t gen_ctx, MIR_reg_t var, bb_insn_t bb_insn) {
  return (var != MIR_NON_VAR && var < VARR_LENGTH (size_t, var_ref_ages)
          && var_ref_ages_addr[var] == curr_bb_var_ref_age
          && var_refs_addr[var].def_p
          /* It is not safe to substitute if there is another use after def insn before
             the current insn as we delete def insn after the substitution. */
          && find_bb_insn_dead_var (bb_insn, var) != NULL);
}